

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunmatrix_sparse.c
# Opt level: O0

SUNErrCode SUNMatZero_Sparse(SUNMatrix A)

{
  sunindextype i;
  SUNMatrix A_local;
  
  for (i = 0; i < *(long *)((long)A->content + 0x10); i = i + 1) {
    *(undefined8 *)(*(long *)((long)A->content + 0x20) + i * 8) = 0;
    *(undefined8 *)(*(long *)((long)A->content + 0x30) + i * 8) = 0;
  }
  for (i = 0; i < *(long *)((long)A->content + 0x18); i = i + 1) {
    *(undefined8 *)(*(long *)((long)A->content + 0x38) + i * 8) = 0;
  }
  *(undefined8 *)(*(long *)((long)A->content + 0x38) + *(long *)((long)A->content + 0x18) * 8) = 0;
  return 0;
}

Assistant:

SUNErrCode SUNMatZero_Sparse(SUNMatrix A)
{
  sunindextype i;

  /* Perform operation */
  for (i = 0; i < SM_NNZ_S(A); i++)
  {
    (SM_DATA_S(A))[i]      = ZERO;
    (SM_INDEXVALS_S(A))[i] = 0;
  }
  for (i = 0; i < SM_NP_S(A); i++) { (SM_INDEXPTRS_S(A))[i] = 0; }
  (SM_INDEXPTRS_S(A))[SM_NP_S(A)] = 0;
  return SUN_SUCCESS;
}